

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

Vec_Str_t * Abc_SclProduceGenlibStrSimple(SC_Lib *p)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  size_t sVar6;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  int i;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int i_1;
  long lVar15;
  char Buffer [200];
  ulong local_110;
  char local_f8 [200];
  
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  pcVar8 = (char *)malloc(1000);
  pVVar7->pArray = pcVar8;
  iVar14 = 0;
  lVar11 = 0;
  while( true ) {
    cVar1 = "GATE _const0_            0.00 z=CONST0;\n"[lVar11];
    if (iVar14 == pVVar7->nCap) {
      if (iVar14 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        uVar2 = iVar14 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc((ulong)uVar2);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,(ulong)uVar2);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = uVar2;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar14 = pVVar7->nSize;
    pVVar7->nSize = iVar14 + 1;
    pcVar8[iVar14] = cVar1;
    if (lVar11 == 0x27) break;
    iVar14 = pVVar7->nSize;
    lVar11 = lVar11 + 1;
  }
  lVar11 = 0;
  do {
    cVar1 = "GATE _const1_            0.00 z=CONST1;\n"[lVar11];
    uVar2 = pVVar7->nSize;
    if (uVar2 == pVVar7->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        sVar9 = (ulong)uVar2 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar9);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = (int)sVar9;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar14 = pVVar7->nSize;
    pVVar7->nSize = iVar14 + 1;
    pcVar8[iVar14] = cVar1;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x28);
  iVar14 = (p->vCells).nSize;
  if (0 < iVar14) {
    lVar11 = 0;
    do {
      puVar4 = (undefined8 *)(p->vCells).pArray[lVar11];
      uVar2 = *(uint *)(puVar4 + 8);
      local_110 = (ulong)uVar2;
      if (local_110 != 0) {
        sVar9 = strlen((char *)*puVar4);
        if (199 < sVar9) {
          __assert_fail("strlen(pCell->pName) < 200",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                        ,0x32c,"Vec_Str_t *Abc_SclProduceGenlibStrSimple(SC_Lib *)");
        }
        if ((int)uVar2 < *(int *)((long)puVar4 + 0x34)) {
          do {
            if ((int)uVar2 < 0) {
LAB_003f26a9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar5 = *(undefined8 **)(puVar4[7] + local_110 * 8);
            lVar15 = 0;
            do {
              cVar1 = "GATE "[lVar15];
              uVar3 = pVVar7->nSize;
              if (uVar3 == pVVar7->nCap) {
                if ((int)uVar3 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = 0x10;
                }
                else {
                  sVar9 = (ulong)uVar3 * 2;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar9);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)sVar9;
                }
              }
              else {
                pcVar8 = pVVar7->pArray;
              }
              iVar14 = pVVar7->nSize;
              pVVar7->nSize = iVar14 + 1;
              pcVar8[iVar14] = cVar1;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 5);
            sprintf(local_f8,"%-16s",*puVar4);
            sVar9 = strlen(local_f8);
            if (0 < (int)(uint)sVar9) {
              uVar13 = 0;
              do {
                cVar1 = local_f8[uVar13];
                uVar3 = pVVar7->nSize;
                if (uVar3 == pVVar7->nCap) {
                  if ((int)uVar3 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    sVar6 = (ulong)uVar3 * 2;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(sVar6);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,sVar6);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = (int)sVar6;
                  }
                }
                else {
                  pcVar8 = pVVar7->pArray;
                }
                iVar14 = pVVar7->nSize;
                pVVar7->nSize = iVar14 + 1;
                pcVar8[iVar14] = cVar1;
                uVar13 = uVar13 + 1;
              } while (((uint)sVar9 & 0x7fffffff) != uVar13);
            }
            uVar3 = pVVar7->nSize;
            if (uVar3 == pVVar7->nCap) {
              if ((int)uVar3 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = 0x10;
              }
              else {
                sVar9 = (ulong)uVar3 * 2;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar9);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar9;
              }
            }
            else {
              pcVar8 = pVVar7->pArray;
            }
            iVar14 = pVVar7->nSize;
            pVVar7->nSize = iVar14 + 1;
            pcVar8[iVar14] = ' ';
            sprintf(local_f8,"%7.2f",SUB84((double)*(float *)(puVar4 + 3),0));
            sVar9 = strlen(local_f8);
            if (0 < (int)(uint)sVar9) {
              uVar13 = 0;
              do {
                cVar1 = local_f8[uVar13];
                uVar3 = pVVar7->nSize;
                if (uVar3 == pVVar7->nCap) {
                  if ((int)uVar3 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    sVar6 = (ulong)uVar3 * 2;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(sVar6);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,sVar6);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = (int)sVar6;
                  }
                }
                else {
                  pcVar8 = pVVar7->pArray;
                }
                iVar14 = pVVar7->nSize;
                pVVar7->nSize = iVar14 + 1;
                pcVar8[iVar14] = cVar1;
                uVar13 = uVar13 + 1;
              } while (((uint)sVar9 & 0x7fffffff) != uVar13);
            }
            uVar3 = pVVar7->nSize;
            if (uVar3 == pVVar7->nCap) {
              if ((int)uVar3 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = 0x10;
              }
              else {
                sVar9 = (ulong)uVar3 * 2;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar9);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar9;
              }
            }
            else {
              pcVar8 = pVVar7->pArray;
            }
            iVar14 = pVVar7->nSize;
            pVVar7->nSize = iVar14 + 1;
            pcVar8[iVar14] = ' ';
            pcVar8 = (char *)*puVar5;
            sVar9 = strlen(pcVar8);
            if (0 < (int)(uint)sVar9) {
              uVar13 = 0;
              do {
                cVar1 = pcVar8[uVar13];
                uVar3 = pVVar7->nSize;
                if (uVar3 == pVVar7->nCap) {
                  if ((int)uVar3 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar10 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar10 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    pVVar7->pArray = pcVar10;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    sVar6 = (ulong)uVar3 * 2;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar10 = (char *)malloc(sVar6);
                    }
                    else {
                      pcVar10 = (char *)realloc(pVVar7->pArray,sVar6);
                    }
                    pVVar7->pArray = pcVar10;
                    pVVar7->nCap = (int)sVar6;
                  }
                }
                else {
                  pcVar10 = pVVar7->pArray;
                }
                iVar14 = pVVar7->nSize;
                pVVar7->nSize = iVar14 + 1;
                pcVar10[iVar14] = cVar1;
                uVar13 = uVar13 + 1;
              } while (((uint)sVar9 & 0x7fffffff) != uVar13);
            }
            uVar3 = pVVar7->nSize;
            if (uVar3 == pVVar7->nCap) {
              if ((int)uVar3 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = 0x10;
              }
              else {
                sVar9 = (ulong)uVar3 * 2;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar9);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar9;
              }
            }
            else {
              pcVar8 = pVVar7->pArray;
            }
            iVar14 = pVVar7->nSize;
            pVVar7->nSize = iVar14 + 1;
            pcVar8[iVar14] = '=';
            pcVar8 = (char *)puVar5[5];
            if (pcVar8 == (char *)0x0) {
              pcVar8 = "?";
            }
            sVar9 = strlen(pcVar8);
            if (0 < (int)(uint)sVar9) {
              uVar13 = 0;
              do {
                cVar1 = pcVar8[uVar13];
                uVar3 = pVVar7->nSize;
                if (uVar3 == pVVar7->nCap) {
                  if ((int)uVar3 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar10 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar10 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    pVVar7->pArray = pcVar10;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    sVar6 = (ulong)uVar3 * 2;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar10 = (char *)malloc(sVar6);
                    }
                    else {
                      pcVar10 = (char *)realloc(pVVar7->pArray,sVar6);
                    }
                    pVVar7->pArray = pcVar10;
                    pVVar7->nCap = (int)sVar6;
                  }
                }
                else {
                  pcVar10 = pVVar7->pArray;
                }
                iVar14 = pVVar7->nSize;
                pVVar7->nSize = iVar14 + 1;
                pcVar10[iVar14] = cVar1;
                uVar13 = uVar13 + 1;
              } while (((uint)sVar9 & 0x7fffffff) != uVar13);
            }
            lVar15 = 0;
            do {
              cVar1 = " ) ;\n"[lVar15 + 3];
              uVar3 = pVVar7->nSize;
              if (uVar3 == pVVar7->nCap) {
                if ((int)uVar3 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = 0x10;
                }
                else {
                  sVar9 = (ulong)uVar3 * 2;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar9);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)sVar9;
                }
              }
              else {
                pcVar8 = pVVar7->pArray;
              }
              iVar14 = pVVar7->nSize;
              pVVar7->nSize = iVar14 + 1;
              pcVar8[iVar14] = cVar1;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 2);
            if (0 < *(int *)(puVar4 + 8)) {
              lVar15 = 0;
              do {
                if (*(int *)((long)puVar4 + 0x34) <= lVar15) goto LAB_003f26a9;
                puVar5 = *(undefined8 **)(puVar4[7] + lVar15 * 8);
                lVar12 = 0;
                do {
                  cVar1 = "         PIN "[lVar12];
                  uVar3 = pVVar7->nSize;
                  if (uVar3 == pVVar7->nCap) {
                    if ((int)uVar3 < 0x10) {
                      if (pVVar7->pArray == (char *)0x0) {
                        pcVar8 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                      }
                      pVVar7->pArray = pcVar8;
                      pVVar7->nCap = 0x10;
                    }
                    else {
                      sVar9 = (ulong)uVar3 * 2;
                      if (pVVar7->pArray == (char *)0x0) {
                        pcVar8 = (char *)malloc(sVar9);
                      }
                      else {
                        pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
                      }
                      pVVar7->pArray = pcVar8;
                      pVVar7->nCap = (int)sVar9;
                    }
                  }
                  else {
                    pcVar8 = pVVar7->pArray;
                  }
                  iVar14 = pVVar7->nSize;
                  pVVar7->nSize = iVar14 + 1;
                  pcVar8[iVar14] = cVar1;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 0xd);
                sprintf(local_f8,"%-4s",*puVar5);
                sVar9 = strlen(local_f8);
                if (0 < (int)(uint)sVar9) {
                  uVar13 = 0;
                  do {
                    cVar1 = local_f8[uVar13];
                    uVar3 = pVVar7->nSize;
                    if (uVar3 == pVVar7->nCap) {
                      if ((int)uVar3 < 0x10) {
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                        }
                        pVVar7->pArray = pcVar8;
                        pVVar7->nCap = 0x10;
                      }
                      else {
                        sVar6 = (ulong)uVar3 * 2;
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(sVar6);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,sVar6);
                        }
                        pVVar7->pArray = pcVar8;
                        pVVar7->nCap = (int)sVar6;
                      }
                    }
                    else {
                      pcVar8 = pVVar7->pArray;
                    }
                    iVar14 = pVVar7->nSize;
                    pVVar7->nSize = iVar14 + 1;
                    pcVar8[iVar14] = cVar1;
                    uVar13 = uVar13 + 1;
                  } while (((uint)sVar9 & 0x7fffffff) != uVar13);
                }
                builtin_strncpy(local_f8 + 0x20,"00  0.00\n",10);
                builtin_strncpy(local_f8 + 0x10,"  1.00  0.00  1.",0x10);
                builtin_strncpy(local_f8," UNKNOWN  1  999",0x10);
                sVar9 = strlen(local_f8);
                if (0 < (int)(uint)sVar9) {
                  uVar13 = 0;
                  do {
                    cVar1 = local_f8[uVar13];
                    uVar3 = pVVar7->nSize;
                    if (uVar3 == pVVar7->nCap) {
                      if ((int)uVar3 < 0x10) {
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(0x10);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                        }
                        pVVar7->pArray = pcVar8;
                        pVVar7->nCap = 0x10;
                      }
                      else {
                        sVar6 = (ulong)uVar3 * 2;
                        if (pVVar7->pArray == (char *)0x0) {
                          pcVar8 = (char *)malloc(sVar6);
                        }
                        else {
                          pcVar8 = (char *)realloc(pVVar7->pArray,sVar6);
                        }
                        pVVar7->pArray = pcVar8;
                        pVVar7->nCap = (int)sVar6;
                      }
                    }
                    else {
                      pcVar8 = pVVar7->pArray;
                    }
                    iVar14 = pVVar7->nSize;
                    pVVar7->nSize = iVar14 + 1;
                    pcVar8[iVar14] = cVar1;
                    uVar13 = uVar13 + 1;
                  } while (((uint)sVar9 & 0x7fffffff) != uVar13);
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < *(int *)(puVar4 + 8));
            }
            local_110 = local_110 + 1;
          } while ((int)local_110 < *(int *)((long)puVar4 + 0x34));
          iVar14 = (p->vCells).nSize;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar14);
  }
  lVar11 = 0;
  do {
    cVar1 = "\n.end\n"[lVar11];
    uVar2 = pVVar7->nSize;
    if (uVar2 == pVVar7->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        sVar9 = (ulong)uVar2 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar9);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = (int)sVar9;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar14 = pVVar7->nSize;
    pVVar7->nSize = iVar14 + 1;
    pcVar8[iVar14] = cVar1;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 6);
  uVar2 = pVVar7->nSize;
  if (uVar2 == pVVar7->nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = 0x10;
    }
    else {
      sVar9 = (ulong)uVar2 * 2;
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar9);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar9;
    }
  }
  else {
    pcVar8 = pVVar7->pArray;
  }
  iVar14 = pVVar7->nSize;
  pVVar7->nSize = iVar14 + 1;
  pcVar8[iVar14] = '\0';
  return pVVar7;
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrSimple( SC_Lib * p )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pCell;
    SC_Pin * pPin, * pPinOut;
    int i, j, k, Count = 2;
    // mark skipped cells
//    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pCell, i )
    {
        if ( pCell->n_inputs == 0 )
            continue;
        assert( strlen(pCell->pName) < 200 );
        SC_CellForEachPinOut( pCell, pPinOut, j )
        {
            Vec_StrPrintStr( vStr, "GATE " );
            sprintf( Buffer, "%-16s", pCell->pName );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            sprintf( Buffer, "%7.2f", pCell->area );
            Vec_StrPrintStr( vStr, Buffer );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, pPinOut->pName );
            Vec_StrPrintStr( vStr, "=" );
            Vec_StrPrintStr( vStr, pPinOut->func_text ? pPinOut->func_text : "?" );
            Vec_StrPrintStr( vStr, ";\n" );
            SC_CellForEachPinIn( pCell, pPin, k )
            {
                Vec_StrPrintStr( vStr, "         PIN " );
                sprintf( Buffer, "%-4s", pPin->pName );
                Vec_StrPrintStr( vStr, Buffer );
                sprintf( Buffer, " UNKNOWN  1  999  1.00  0.00  1.00  0.00\n" );
                Vec_StrPrintStr( vStr, Buffer );
            }
            Count++;
        }
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    return vStr;
}